

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUnits.c
# Opt level: O2

void inmateMove(UnitList *inmateList,Path *path)

{
  uint uVar1;
  undefined1 *puVar2;
  TileNode *pTVar3;
  UnitNode *pUVar4;
  Path *pPVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  float fVar9;
  
  if (inmateList == (UnitList *)0x0) {
    pUVar4 = (UnitNode *)0x0;
  }
  else {
    pUVar4 = inmateList->head;
  }
  uVar1 = path->count;
  do {
    puVar2 = (undefined1 *)pUVar4->unit;
    pPVar5 = path;
    uVar6 = uVar1;
    while( true ) {
      pTVar3 = pPVar5->first;
      bVar8 = uVar6 == 0;
      uVar6 = uVar6 - 1;
      if (bVar8) break;
      fVar9 = *(float *)(puVar2 + 4);
      iVar7 = (int)fVar9;
      if (pTVar3->location == iVar7) goto LAB_001042ef;
      pPVar5 = (Path *)&pTVar3->next;
    }
    fVar9 = *(float *)(puVar2 + 4);
    iVar7 = (int)fVar9;
LAB_001042ef:
    fVar9 = (float)*(uint *)(puVar2 + 0x10) * 0.125 + fVar9;
    *(float *)(puVar2 + 4) = fVar9;
    if (iVar7 + 1 == (int)fVar9) {
      if (pTVar3->next == (TileNode *)0x0) {
        *puVar2 = 1;
      }
      else {
        *(float *)(puVar2 + 4) = (float)pTVar3->next->location;
      }
    }
    pUVar4 = pUVar4->next;
    if ((pUVar4 == (UnitNode *)0x0) || (pUVar4->next == (UnitNode *)0x0)) {
      return;
    }
  } while( true );
}

Assistant:

void inmateMove(struct UnitList *inmateList, struct Path *path) {
    struct UnitNode *nextInmate;
    struct TileNode *nextTile;
    int prevPos;

    nextInmate = getHead(inmateList);
    do {
        nextTile = path->first;
        for (int i = 0; i < path->count; i++) {
            if (nextTile->location ==
                (int) ((struct Inmate *) nextInmate->unit)->position)
                break;
            nextTile = nextTile->next;
        }
        prevPos = ((struct Inmate *) nextInmate->unit)->position;
        ((struct Inmate *) nextInmate->unit)->position =
            ((struct Inmate *) nextInmate->unit)->position +
                (float) ((struct Inmate *) nextInmate->unit)->speed / 8;
        if ((int) ((struct Inmate *) nextInmate->unit)->position ==
            prevPos + 1 && nextTile->next != NULL)
            ((struct Inmate *) nextInmate->unit)->position = nextTile->next->location;
        else if ((int) ((struct Inmate *) nextInmate->unit)->position ==
            prevPos + 1 && nextTile->next == NULL) {
            ((struct Inmate *) nextInmate->unit)->delUnit = TRUE;
            //endwin();
        }
        nextInmate = getNext(nextInmate);
    } while (getNext(nextInmate));
}